

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O0

void __thiscall
Interpreter::Interpreter
          (Interpreter *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *lexed_data)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>
  __l;
  PrintCommand *this_00;
  SleepCommand *this_01;
  OpenDataServerCommand *this_02;
  ConnectCommand *this_03;
  AssignVarCommand *this_04;
  DefineVarCommand *this_05;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  *local_208;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>
  local_1a2;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1a1;
  simulatorCommand local_1a0 [11];
  simulatorCommand local_174;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  *local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_50;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *lexed_data_local;
  Interpreter *this_local;
  
  local_18 = (undefined1  [8])lexed_data;
  lexed_data_local = &this->lexed_data_to_interpret;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->lexed_data_to_interpret);
  this->print_command = (PrintCommand *)0x0;
  this->sleep_command = (SleepCommand *)0x0;
  this->open_data_server_command = (OpenDataServerCommand *)0x0;
  this->connect_command = (ConnectCommand *)0x0;
  this->assign_var_command = (AssignVarCommand *)0x0;
  this->define_var_command = (DefineVarCommand *)0x0;
  this->while_command = (WhileCommand *)0x0;
  this->if_command = (IfCommand *)0x0;
  this->is_if_command = false;
  this->is_while_command = false;
  std::__cxx11::string::string((string *)&this->condition_string);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->condition_vector_string);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->while_strings_vectors);
  std::vector<Command_*,_std::allocator<Command_*>_>::vector(&this->while_commands_pointers);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->if_strings_vectors);
  std::vector<Command_*,_std::allocator<Command_*>_>::vector(&this->if_commands_pointers);
  local_170 = &local_168;
  local_174 = OPEN_DATA_SERVER;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[15],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [15])"openDataServer",&local_174);
  local_170 = &local_140;
  local_1a0[6] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[21],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [21])"connectControlClient",local_1a0 + 6);
  local_170 = &local_118;
  local_1a0[5] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[4],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [4])"var",local_1a0 + 5);
  local_170 = &local_f0;
  local_1a0[4] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[6],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [6])"Print",local_1a0 + 4);
  local_170 = &local_c8;
  local_1a0[3] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[6],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [6])"Sleep",local_1a0 + 3);
  local_170 = &local_a0;
  local_1a0[2] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[6],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [6])"while",local_1a0 + 2);
  local_170 = &local_78;
  local_1a0[1] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[3],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [3])"if",local_1a0 + 1);
  local_170 = &local_50;
  local_1a0[0] = END_CONDITION;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  ::pair<const_char_(&)[2],_Interpreter::simulatorCommand,_true>
            (local_170,(char (*) [2])"}",local_1a0);
  local_28 = &local_168;
  local_20 = 8;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>
  ::allocator(&local_1a2);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
  ::map(&this->CMD_DICTIONARY,__l,&local_1a1,&local_1a2);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>
  ::~allocator(&local_1a2);
  local_208 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
               *)&local_28;
  do {
    local_208 = local_208 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
    ::~pair(local_208);
  } while (local_208 != &local_168);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=(&this->lexed_data_to_interpret,lexed_data);
  this_00 = (PrintCommand *)operator_new(0x28);
  (this_00->message)._M_string_length = 0;
  (this_00->message).field_2._M_allocated_capacity = 0;
  (this_00->super_Command)._vptr_Command = (_func_int **)0x0;
  *(undefined8 *)&this_00->message = 0;
  *(undefined8 *)((long)&(this_00->message).field_2 + 8) = 0;
  PrintCommand::PrintCommand(this_00);
  this->print_command = this_00;
  this_01 = (SleepCommand *)operator_new(0x30);
  *(undefined8 *)((long)&(this_01->time_to_sleep_string).field_2 + 8) = 0;
  *(undefined8 *)&this_01->milliseconds = 0;
  (this_01->time_to_sleep_string)._M_string_length = 0;
  (this_01->time_to_sleep_string).field_2._M_allocated_capacity = 0;
  (this_01->super_Command)._vptr_Command = (_func_int **)0x0;
  *(undefined8 *)&this_01->time_to_sleep_string = 0;
  SleepCommand::SleepCommand(this_01);
  this->sleep_command = this_01;
  this_02 = (OpenDataServerCommand *)operator_new(0x40);
  *(undefined8 *)&this_02->client_socket = 0;
  this_02->client_socket_pointer = (int *)0x0;
  (this_02->port_string).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_02->port_string).field_2 + 8) = 0;
  *(undefined8 *)&this_02->port_string = 0;
  (this_02->port_string)._M_string_length = 0;
  (this_02->super_Command)._vptr_Command = (_func_int **)0x0;
  *(undefined8 *)&this_02->port = 0;
  OpenDataServerCommand::OpenDataServerCommand(this_02);
  this->open_data_server_command = this_02;
  this_03 = (ConnectCommand *)operator_new(0x30);
  ConnectCommand::ConnectCommand(this_03);
  this->connect_command = this_03;
  this_04 = (AssignVarCommand *)operator_new(0x28);
  AssignVarCommand::AssignVarCommand(this_04);
  this->assign_var_command = this_04;
  this_05 = (DefineVarCommand *)operator_new(0x20);
  DefineVarCommand::DefineVarCommand(this_05);
  this->define_var_command = this_05;
  return;
}

Assistant:

Interpreter::Interpreter(vector<vector<string>> lexed_data) {
  this->lexed_data_to_interpret = lexed_data;
  this->print_command = new PrintCommand();
  this->sleep_command = new SleepCommand();
  this->open_data_server_command = new OpenDataServerCommand();
  this->connect_command = new ConnectCommand();
  this->assign_var_command = new AssignVarCommand();
  this->define_var_command = new DefineVarCommand();
}